

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texel_fetch_invalid_sample
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType DVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  char *__s;
  long *plVar4;
  size_type *psVar5;
  DataType dataType;
  long lVar6;
  string shaderSource;
  DataType in_stack_fffffffffffffd18;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  long local_98;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  bVar3 = true;
  if (!bVar2) {
    NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
              (&local_50,(_anonymous_namespace_ *)0x2d,dataType);
    bVar3 = NegativeTestContext::isExtensionSupported(ctx,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (bVar3 != false) {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2e0,"texelFetch: Invalid sample type.","");
    NegativeTestContext::beginSection(ctx,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    lVar6 = 0;
    do {
      shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar6];
      bVar3 = NegativeTestContext::isShaderSupported(ctx,shaderType);
      if (bVar3) {
        __s = glu::getShaderTypeName(shaderType);
        std::__cxx11::string::string<std::allocator<char>>((string *)local_90,__s,&local_2b9);
        plVar4 = (long *)std::__cxx11::string::replace((ulong)local_90,0,(char *)0x0,0x1cc56f3);
        local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
        psVar5 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_2e0.field_2._M_allocated_capacity = *psVar5;
          local_2e0.field_2._8_8_ = plVar4[3];
        }
        else {
          local_2e0.field_2._M_allocated_capacity = *psVar5;
          local_2e0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_2e0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        NegativeTestContext::beginSection(ctx,&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        local_98 = lVar6;
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        lVar6 = 0;
        do {
          DVar1 = *(DataType *)
                   ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes + lVar6)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_d8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_138,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_158,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_158);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != &local_158.field_2) {
            operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          if (lVar6 != 0) {
            DVar1 = *(DataType *)
                     ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar6)
            ;
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                       in_stack_fffffffffffffd18);
            local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_178,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_dataplus._M_p != &local_178.field_2) {
              operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                       in_stack_fffffffffffffd18);
            local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_198,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_198);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                       in_stack_fffffffffffffd18);
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                       in_stack_fffffffffffffd18);
            local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d8,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_1d8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
              operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                       in_stack_fffffffffffffd18);
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f8,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_1f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
            NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                      (&local_2e0,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                       in_stack_fffffffffffffd18);
            local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_218,local_2e0._M_dataplus._M_p,
                       local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
            verifyShader(ctx,shaderType,&local_218);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_218._M_dataplus._M_p != &local_218.field_2) {
              operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
              operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          DVar1 = *(DataType *)
                   ((long)deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes + lVar6)
          ;
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x42,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_238,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_238);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x43,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_258,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_258);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x44,TYPE_INT_VEC2,DVar1,
                     in_stack_fffffffffffffd18);
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_278,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_278);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x58,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_298,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x59,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2b8,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_2b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          NegativeTestShared::(anonymous_namespace)::genShaderSourceTexelFetch_abi_cxx11_
                    (&local_2e0,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,0x5a,TYPE_INT_VEC3,DVar1,
                     in_stack_fffffffffffffd18);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_2e0._M_dataplus._M_p,
                     local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
          verifyShader(ctx,shaderType,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
          }
          lVar6 = lVar6 + 4;
        } while (lVar6 != 0x10);
        NegativeTestContext::endSection(ctx);
        lVar6 = local_98;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    NegativeTestContext::endSection(ctx);
  }
  return;
}

Assistant:

void texel_fetch_invalid_sample (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(glu::TYPE_SAMPLER_CUBE_ARRAY)))
	{
		ctx.beginSection("texelFetch: Invalid sample type.");
		for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
		{
			if (ctx.isShaderSupported(s_shaders[shaderNdx]))
			{
				ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
				for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_floatTypes); ++dataTypeNdx)
				{
					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_floatTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					if (s_intTypes[dataTypeNdx] != glu::TYPE_INT)
					{
						// SAMPLER_2D_MULTISAMPLE
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}

						// SAMPLER_2D_MULTISAMPLE_ARRAY
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
						{
							const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_intTypes[dataTypeNdx]));
							verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
						}
					}

					// SAMPLER_2D_MULTISAMPLE
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE, glu::TYPE_INT_VEC2, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}

					// SAMPLER_2D_MULTISAMPLE_ARRAY
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_INT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceTexelFetch(ctx, s_shaders[shaderNdx], glu::TYPE_UINT_SAMPLER_2D_MULTISAMPLE_ARRAY, glu::TYPE_INT_VEC3, s_uintTypes[dataTypeNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
				ctx.endSection();
			}
		}
		ctx.endSection();
	}
}